

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

bool VerifyXrParent(XrObjectType handle1_type,uint64_t handle1,XrObjectType handle2_type,
                   uint64_t handle2,bool check_this)

{
  bool bVar1;
  uint64_t parent2_handle;
  uint64_t parent1_handle;
  XrObjectType parent2_type;
  XrObjectType parent1_type;
  
  if (handle2 != 0 && handle1 != 0) {
    if (check_this && handle1_type == handle2_type) {
      return handle1 == handle2;
    }
    if (handle2_type == XR_OBJECT_TYPE_INSTANCE || handle1_type != XR_OBJECT_TYPE_INSTANCE) {
      if (handle1_type == XR_OBJECT_TYPE_INSTANCE || handle2_type != XR_OBJECT_TYPE_INSTANCE) {
        bVar1 = GetXrParent(handle1_type,handle1,&parent1_type,&parent1_handle);
        if ((bVar1) &&
           (bVar1 = GetXrParent(handle2_type,handle2,&parent2_type,&parent2_handle), bVar1)) {
          if (parent1_type == handle2_type) {
            return parent1_handle == handle2;
          }
          if (parent2_type == handle1_type) {
            return CONCAT44(parent2_handle._4_4_,(XrObjectType)parent2_handle) == handle1;
          }
          handle2 = CONCAT44(parent2_handle._4_4_,(XrObjectType)parent2_handle);
          handle1 = parent1_handle;
          parent2_handle._0_4_ = parent1_type;
          goto LAB_001356b3;
        }
      }
      else {
        bVar1 = GetXrParent(handle1_type,handle1,(XrObjectType *)&parent2_handle,&parent1_handle);
        if (bVar1) {
          parent2_type = XR_OBJECT_TYPE_INSTANCE;
          handle1 = parent1_handle;
LAB_001356b3:
          bVar1 = VerifyXrParent((XrObjectType)parent2_handle,handle1,parent2_type,handle2,true);
          return bVar1;
        }
      }
    }
    else {
      bVar1 = GetXrParent(handle2_type,handle2,(XrObjectType *)&parent2_handle,&parent1_handle);
      if (bVar1) {
        handle2 = parent1_handle;
        parent2_type = (XrObjectType)parent2_handle;
        parent2_handle._0_4_ = XR_OBJECT_TYPE_INSTANCE;
        goto LAB_001356b3;
      }
    }
  }
  return false;
}

Assistant:

bool VerifyXrParent(XrObjectType handle1_type, const uint64_t handle1,
                    XrObjectType handle2_type, const uint64_t handle2,
                    bool check_this) {
    if (IsIntegerNullHandle(handle1) || IsIntegerNullHandle(handle2)) {
        return false;
    } else if (check_this && handle1_type == handle2_type) {
        return (handle1 == handle2);
    }
    if (handle1_type == XR_OBJECT_TYPE_INSTANCE && handle2_type != XR_OBJECT_TYPE_INSTANCE) {
        XrObjectType parent_type;
        uint64_t parent_handle;
        if (!GetXrParent(handle2_type, handle2, parent_type, parent_handle)) {
            return false;
        }
        return VerifyXrParent(handle1_type, handle1, parent_type, parent_handle, true);
    } else if (handle2_type == XR_OBJECT_TYPE_INSTANCE && handle1_type != XR_OBJECT_TYPE_INSTANCE) {
        XrObjectType parent_type;
        uint64_t parent_handle;
        if (!GetXrParent(handle1_type, handle1, parent_type, parent_handle)) {
            return false;
        }
        return VerifyXrParent(parent_type, parent_handle, handle2_type, handle2, true);
    } else {
        XrObjectType parent1_type;
        uint64_t parent1_handle;
                XrObjectType parent2_type;
        uint64_t parent2_handle;
        if (!GetXrParent(handle1_type, handle1, parent1_type, parent1_handle)) {
            return false;
        }
        if (!GetXrParent(handle2_type, handle2, parent2_type, parent2_handle)) {
            return false;
        }
        if (parent1_type == handle2_type) {
            return (parent1_handle == handle2);
        } else if (handle1_type == parent2_type) {
            return (handle1 == parent2_handle);
        } else {
            return VerifyXrParent(parent1_type, parent1_handle, parent2_type, parent2_handle, true);
        }
    }
    return false;
}